

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badfp.c
# Opt level: O0

int main(int argc,char **argv)

{
  _func_void *f;
  void *addr;
  char **ppcStack_18;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  f = (_func_void *)0x0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    while( true ) {
      addr._4_4_ = getopt((int)argv_local,ppcStack_18,"dh");
      if (addr._4_4_ == -1) {
        (*f)();
        return argv_local._4_4_;
      }
      if (addr._4_4_ != 100) break;
      f = (_func_void *)&f;
    }
    if (addr._4_4_ != 0x68) break;
    signal(0xb,sighandle);
  }
  abort();
}

Assistant:

int
main(int argc, char *argv[])
{
   int c;
   void *addr = 0;
   while ((c = getopt(argc, argv, "dh")) != -1) {
      switch (c) {
         case 'h': // handle the fault with a signal handler.
            signal(SIGSEGV, sighandle);
            break;
         case 'd': // handle the fault with a signal handler.
            addr = &addr;
            break;
         default:
            abort();
      }
   }

   void (*f)(void) = addr;
   f();
}